

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,true,false>
               (timestamp_t *ldata,timestamp_t *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  timestamp_t tVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int64_t *piVar7;
  idx_t iVar8;
  timestamp_t lentry;
  timestamp_t lentry_1;
  ulong uVar9;
  ulong uVar10;
  interval_t iVar11;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      tVar3 = (timestamp_t)ldata->value;
      piVar7 = &result_data->micros;
      iVar8 = 0;
      do {
        iVar11 = Interval::GetDifference(tVar3,(timestamp_t)rdata[iVar8].value);
        ((interval_t *)(piVar7 + -1))->months = (int)iVar11._0_8_;
        ((interval_t *)(piVar7 + -1))->days = (int)((ulong)iVar11._0_8_ >> 0x20);
        *piVar7 = iVar11.micros;
        iVar8 = iVar8 + 1;
        piVar7 = piVar7 + 2;
      } while (count != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar6 = 0;
    uVar5 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar9 = count;
        }
LAB_01096e72:
        uVar4 = uVar6;
        if (uVar6 < uVar9) {
          tVar3 = (timestamp_t)ldata->value;
          piVar7 = &result_data[uVar6].micros;
          do {
            iVar11 = Interval::GetDifference(tVar3,(timestamp_t)rdata[uVar6].value);
            ((interval_t *)(piVar7 + -1))->months = (int)iVar11._0_8_;
            ((interval_t *)(piVar7 + -1))->days = (int)((ulong)iVar11._0_8_ >> 0x20);
            *piVar7 = iVar11.micros;
            uVar6 = uVar6 + 1;
            piVar7 = piVar7 + 2;
            uVar4 = uVar9;
          } while (uVar9 != uVar6);
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar9 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar9 = count;
        }
        uVar4 = uVar9;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_01096e72;
          uVar4 = uVar6;
          if (uVar6 < uVar9) {
            piVar7 = &result_data[uVar6].micros;
            uVar10 = 0;
            do {
              if ((uVar2 >> (uVar10 & 0x3f) & 1) != 0) {
                iVar11 = Interval::GetDifference
                                   ((timestamp_t)ldata->value,
                                    (timestamp_t)rdata[uVar6 + uVar10].value);
                ((interval_t *)(piVar7 + -1))->months = (int)iVar11._0_8_;
                ((interval_t *)(piVar7 + -1))->days = (int)((ulong)iVar11._0_8_ >> 0x20);
                *piVar7 = iVar11.micros;
              }
              uVar10 = uVar10 + 1;
              piVar7 = piVar7 + 2;
              uVar4 = uVar9;
            } while (uVar9 - uVar6 != uVar10);
          }
        }
      }
      uVar6 = uVar4;
      uVar5 = uVar5 + 1;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}